

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_set_decode_area
                   (opj_j2k_t *p_j2k,opj_image_t *p_image,OPJ_INT32 p_start_x,OPJ_INT32 p_start_y,
                   OPJ_INT32 p_end_x,OPJ_INT32 p_end_y,opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  uint uVar2;
  opj_image_t *poVar3;
  opj_image_comp_t *poVar4;
  OPJ_UINT32 OVar5;
  OPJ_BOOL OVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  
  uVar7 = (ulong)(uint)p_start_x;
  poVar3 = p_j2k->m_private_image;
  if (((((p_j2k->m_cp).tw != 1) || ((p_j2k->m_cp).th != 1)) ||
      (((p_j2k->m_cp).tcps)->m_data == (OPJ_BYTE *)0x0)) &&
     ((p_j2k->m_specific_param).m_decoder.m_state != 8)) {
    opj_event_msg(p_manager,1,
                  "Need to decode the main header before begin to decode the remaining codestream.\n"
                 );
    return 0;
  }
  uVar2 = p_image->numcomps;
  if ((ulong)uVar2 != 0) {
    poVar4 = p_image->comps;
    lVar9 = 0;
    do {
      *(OPJ_UINT32 *)((long)&poVar4->factor + lVar9) = (p_j2k->m_cp).m_specific_param.m_dec.m_reduce
      ;
      lVar9 = lVar9 + 0x40;
    } while ((ulong)uVar2 << 6 != lVar9);
  }
  if (((p_start_y == 0 && p_start_x == 0) && p_end_x == 0) && p_end_y == 0) {
    opj_event_msg(p_manager,4,
                  "No decoded area parameters, set the decoded area to the whole image\n");
    *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = *(OPJ_BYTE **)&(p_j2k->m_cp).tw;
    p_image->x0 = poVar3->x0;
    p_image->y0 = poVar3->y0;
    p_image->x1 = poVar3->x1;
    p_image->y1 = poVar3->y1;
    OVar6 = opj_j2k_update_image_dimensions(p_image,p_manager);
    return OVar6;
  }
  if (p_start_x < 0) {
    pcVar8 = "Left position of the decoded area (region_x0=%d) should be >= 0.\n";
LAB_00111c62:
    opj_event_msg(p_manager,1,pcVar8,uVar7);
  }
  else {
    if (poVar3->x1 < (uint)p_start_x) {
      pcVar8 = 
      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n";
    }
    else {
      if ((uint)p_start_x < poVar3->x0) {
        opj_event_msg(p_manager,2,
                      "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n"
                     );
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x = 0;
        p_start_x = poVar3->x0;
      }
      else {
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
             (p_start_x - (p_j2k->m_cp).tx0) / (p_j2k->m_cp).tdx;
      }
      p_image->x0 = p_start_x;
      if (p_start_y < 0) {
        pcVar8 = "Up position of the decoded area (region_y0=%d) should be >= 0.\n";
        uVar7 = (ulong)(uint)p_start_y;
        goto LAB_00111c62;
      }
      if (poVar3->y1 < (uint)p_start_y) {
        pcVar8 = 
        "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n";
        uVar7 = (ulong)(uint)p_start_y;
      }
      else {
        if ((uint)p_start_y < poVar3->y0) {
          opj_event_msg(p_manager,2,
                        "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n"
                        ,(ulong)(uint)p_start_y);
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y = 0;
          p_start_y = poVar3->y0;
        }
        else {
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
               (p_start_y - (p_j2k->m_cp).ty0) / (p_j2k->m_cp).tdy;
        }
        p_image->y0 = p_start_y;
        if (p_end_x < 1) {
          pcVar8 = "Right position of the decoded area (region_x1=%d) should be > 0.\n";
          uVar7 = (ulong)(uint)p_end_x;
          goto LAB_00111c62;
        }
        if ((uint)p_end_x < poVar3->x0) {
          pcVar8 = 
          "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n"
          ;
          uVar7 = (ulong)(uint)p_end_x;
        }
        else {
          if (poVar3->x1 < (uint)p_end_x) {
            opj_event_msg(p_manager,2,
                          "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n"
                          ,(ulong)(uint)p_end_x);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = (p_j2k->m_cp).tw;
            p_end_x = poVar3->x1;
          }
          else {
            OVar5 = opj_int_ceildiv(p_end_x - (p_j2k->m_cp).tx0,(p_j2k->m_cp).tdx);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = OVar5;
          }
          p_image->x1 = p_end_x;
          uVar7 = (ulong)(uint)p_end_y;
          if (p_end_y < 1) {
            pcVar8 = "Bottom position of the decoded area (region_y1=%d) should be > 0.\n";
            goto LAB_00111c62;
          }
          if (poVar3->y0 <= (uint)p_end_y) {
            if (poVar3->y1 < (uint)p_end_y) {
              opj_event_msg(p_manager,2,
                            "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n"
                           );
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = (p_j2k->m_cp).th;
              p_end_y = poVar3->y1;
            }
            else {
              OVar5 = opj_int_ceildiv(p_end_y - (p_j2k->m_cp).ty0,(p_j2k->m_cp).tdy);
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = OVar5;
            }
            p_image->y1 = p_end_y;
            pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x50);
            *pbVar1 = *pbVar1 | 2;
            OVar6 = opj_j2k_update_image_dimensions(p_image,p_manager);
            if (OVar6 == 0) {
              return 0;
            }
            opj_event_msg(p_manager,4,"Setting decoding area to %d,%d,%d,%d\n",(ulong)p_image->x0,
                          (ulong)p_image->y0,(ulong)p_image->x1,p_image->y1);
            return OVar6;
          }
          pcVar8 = 
          "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n"
          ;
        }
      }
    }
    opj_event_msg(p_manager,1,pcVar8,uVar7);
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_set_decode_area(opj_j2k_t *p_j2k,
                                 opj_image_t* p_image,
                                 OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
                                 OPJ_INT32 p_end_x, OPJ_INT32 p_end_y,
                                 opj_event_mgr_t * p_manager)
{
    opj_cp_t * l_cp = &(p_j2k->m_cp);
    opj_image_t * l_image = p_j2k->m_private_image;
    OPJ_BOOL ret;
    OPJ_UINT32 it_comp;

    if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
            p_j2k->m_cp.tcps[0].m_data != NULL) {
        /* In the case of a single-tiled image whose codestream we have already */
        /* ingested, go on */
    }
    /* Check if we are read the main header */
    else if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Need to decode the main header before begin to decode the remaining codestream.\n");
        return OPJ_FALSE;
    }

    /* Update the comps[].factor member of the output image with the one */
    /* of m_reduce */
    for (it_comp = 0; it_comp < p_image->numcomps; ++it_comp) {
        p_image->comps[it_comp].factor = p_j2k->m_cp.m_specific_param.m_dec.m_reduce;
    }

    if (!p_start_x && !p_start_y && !p_end_x && !p_end_y) {
        opj_event_msg(p_manager, EVT_INFO,
                      "No decoded area parameters, set the decoded area to the whole image\n");

        p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
        p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
        p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
        p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;

        p_image->x0 = l_image->x0;
        p_image->y0 = l_image->y0;
        p_image->x1 = l_image->x1;
        p_image->y1 = l_image->y1;

        return opj_j2k_update_image_dimensions(p_image, p_manager);
    }

    /* ----- */
    /* Check if the positions provided by the user are correct */

    /* Left */
    if (p_start_x < 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Left position of the decoded area (region_x0=%d) should be >= 0.\n",
                      p_start_x);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_x > l_image->x1) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n",
                      p_start_x, l_image->x1);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_x < l_image->x0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n",
                      p_start_x, l_image->x0);
        p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
        p_image->x0 = l_image->x0;
    } else {
        p_j2k->m_specific_param.m_decoder.m_start_tile_x = ((OPJ_UINT32)p_start_x -
                l_cp->tx0) / l_cp->tdx;
        p_image->x0 = (OPJ_UINT32)p_start_x;
    }

    /* Up */
    if (p_start_y < 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Up position of the decoded area (region_y0=%d) should be >= 0.\n",
                      p_start_y);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_y > l_image->y1) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n",
                      p_start_y, l_image->y1);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_y < l_image->y0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n",
                      p_start_y, l_image->y0);
        p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
        p_image->y0 = l_image->y0;
    } else {
        p_j2k->m_specific_param.m_decoder.m_start_tile_y = ((OPJ_UINT32)p_start_y -
                l_cp->ty0) / l_cp->tdy;
        p_image->y0 = (OPJ_UINT32)p_start_y;
    }

    /* Right */
    if (p_end_x <= 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Right position of the decoded area (region_x1=%d) should be > 0.\n",
                      p_end_x);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_end_x < l_image->x0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n",
                      p_end_x, l_image->x0);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_end_x > l_image->x1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n",
                      p_end_x, l_image->x1);
        p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
        p_image->x1 = l_image->x1;
    } else {
        p_j2k->m_specific_param.m_decoder.m_end_tile_x = (OPJ_UINT32)opj_int_ceildiv(
                    p_end_x - (OPJ_INT32)l_cp->tx0, (OPJ_INT32)l_cp->tdx);
        p_image->x1 = (OPJ_UINT32)p_end_x;
    }

    /* Bottom */
    if (p_end_y <= 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Bottom position of the decoded area (region_y1=%d) should be > 0.\n",
                      p_end_y);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_end_y < l_image->y0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n",
                      p_end_y, l_image->y0);
        return OPJ_FALSE;
    }
    if ((OPJ_UINT32)p_end_y > l_image->y1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n",
                      p_end_y, l_image->y1);
        p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
        p_image->y1 = l_image->y1;
    } else {
        p_j2k->m_specific_param.m_decoder.m_end_tile_y = (OPJ_UINT32)opj_int_ceildiv(
                    p_end_y - (OPJ_INT32)l_cp->ty0, (OPJ_INT32)l_cp->tdy);
        p_image->y1 = (OPJ_UINT32)p_end_y;
    }
    /* ----- */

    p_j2k->m_specific_param.m_decoder.m_discard_tiles = 1;

    ret = opj_j2k_update_image_dimensions(p_image, p_manager);

    if (ret) {
        opj_event_msg(p_manager, EVT_INFO, "Setting decoding area to %d,%d,%d,%d\n",
                      p_image->x0, p_image->y0, p_image->x1, p_image->y1);
    }

    return ret;
}